

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgen.c
# Opt level: O2

int process_options(int cnt,char **args)

{
  char *__src;
  int iVar1;
  size_t sVar2;
  undefined8 uVar3;
  
LAB_00104208:
  iVar1 = __posix_getopt(cnt,args,"ab:cdhi:n:Nl:o:p:r:s:t:vx");
  __src = _optarg;
  switch(iVar1) {
  case 0x61:
    flags._1_1_ = flags._1_1_ | 2;
    goto LAB_00104208;
  case 0x62:
    sVar2 = strlen(_optarg);
    d_path = (char *)malloc((long)((sVar2 << 0x20) + 0x100000000) >> 0x20);
    if (d_path != (char *)0x0) {
      strcpy(d_path,__src);
      goto LAB_00104208;
    }
    uVar3 = 0x122;
    break;
  case 99:
    flags._1_1_ = flags._1_1_ | 8;
    goto LAB_00104208;
  case 100:
    flags._0_1_ = (byte)flags | 1;
    goto LAB_00104208;
  case 0x68:
    usage();
    exit(0);
  case 0x69:
    sVar2 = strlen(_optarg);
    ifile = (char *)malloc((long)((sVar2 << 0x20) + 0x100000000) >> 0x20);
    if (ifile != (char *)0x0) {
      strcpy(ifile,__src);
      flags._1_1_ = flags._1_1_ | 0x10;
      goto LAB_00104208;
    }
    uVar3 = 0x131;
    break;
  case 0x6c:
    sVar2 = strlen(_optarg);
    lfile = (char *)malloc((long)((sVar2 << 0x20) + 0x100000000) >> 0x20);
    if (lfile != (char *)0x0) {
      strcpy(lfile,__src);
      flags._0_1_ = (byte)flags | 0x40;
      goto LAB_00104208;
    }
    uVar3 = 0x137;
    break;
  case 0x6e:
    sVar2 = strlen(_optarg);
    db_name = (char *)malloc((long)((sVar2 << 0x20) + 0x100000000) >> 0x20);
    if (db_name != (char *)0x0) {
      strcpy(db_name,__src);
      flags._0_1_ = (byte)flags | 8;
      goto LAB_00104208;
    }
    uVar3 = 0x140;
    break;
  case 0x6f:
    sVar2 = strlen(_optarg);
    osuff = (char *)malloc((long)((sVar2 << 0x20) + 0x100000000) >> 0x20);
    if (osuff != (char *)0x0) {
      strcpy(osuff,__src);
      flags._0_1_ = (byte)flags | 2;
      goto LAB_00104208;
    }
    uVar3 = 0x146;
    break;
  case 0x70:
    snum = atoi(_optarg);
    goto LAB_00104208;
  case 0x72:
    flags._1_1_ = flags._1_1_ | 4;
    rndm = atol(_optarg);
    goto LAB_00104208;
  case 0x73:
    flt_scale = atof(_optarg);
    if (100000 < scale) {
      fprintf(_stderr,"%s %5.0f %s\n%s\n",0x40f86a0000000000,"WARNING: Support for scale factors >",
              "GB is still in development.","Data set integrity is not guaranteed.\n");
    }
    goto LAB_00104208;
  case 0x74:
    sVar2 = strlen(_optarg);
    tfile = (char *)malloc((long)((sVar2 << 0x20) + 0x100000000) >> 0x20);
    if (tfile != (char *)0x0) {
      strcpy(tfile,__src);
      flags._1_1_ = flags._1_1_ | 0x20;
      goto LAB_00104208;
    }
    uVar3 = 0x15c;
    break;
  case 0x76:
    flags._0_1_ = (byte)flags | 0x10;
    goto LAB_00104208;
  case 0x78:
    flags._0_1_ = (byte)flags | 4;
    goto LAB_00104208;
  default:
    if (iVar1 == 0x4e) goto code_r0x00104238;
    if (iVar1 == -1) {
      return 0;
    }
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x71:
  case 0x75:
  case 0x77:
    printf("unknown option \'%s\' ignored\n",args[_optind]);
    usage();
LAB_001045c5:
    exit(1);
  }
  fprintf(_stderr,"Malloc failed at %s:%d\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/eyalroz[P]tpch-dbgen/src/qgen.c"
          ,uVar3);
  goto LAB_001045c5;
code_r0x00104238:
  flags._1_1_ = flags._1_1_ | 0x40;
  goto LAB_00104208;
}

Assistant:

int
process_options(int cnt, char **args)
{
    int flag;

    while((flag = getopt(cnt, args, "ab:cdhi:n:Nl:o:p:r:s:t:vx")) != -1)
        switch(flag)
            {
            case 'a':   /* use ANSI semantics */
                flags |= ANSI;
                break;
			case 'b':               /* load distributions from named file */
				d_path = (char *)malloc((int)strlen(optarg) + 1);
				MALLOC_CHECK(d_path);
				strcpy(d_path, optarg);
				break;
			case 'c':   /* retain comments in EQT */
                flags |= COMMENT;
                break;
            case 'd':   /* use default substitution values */
                flags |= DFLT;
                break;
            case 'h':   /* just generate the usage summary */
                usage();
                exit(0);
                break;
            case 'i':   /* set stream initialization file name */
                ifile = malloc((int)strlen(optarg) + 1);
                MALLOC_CHECK(ifile);
                strcpy(ifile, optarg);
                flags |= INIT;
                break;
            case 'l':   /* log parameter usages */
                lfile = malloc((int)strlen(optarg) + 1);
                MALLOC_CHECK(lfile);
                strcpy(lfile, optarg);
                flags |= LOG;
                break;
            case 'N':   /* use default rowcounts */
                flags |= DFLT_NUM;
                break;
            case 'n':   /* set database name */
                db_name = malloc((int)strlen(optarg) + 1);
                MALLOC_CHECK(db_name);
                strcpy(db_name, optarg);
                flags |= DBASE;
                break;
            case 'o':   /* set the output path */
                osuff = malloc((int)strlen(optarg) + 1);
                MALLOC_CHECK(osuff);
                strcpy(osuff, optarg);
                flags |=OUTPUT;
                break;
            case 'p':   /* permutation for a given stream */
                snum = atoi(optarg);
                break;
            case 'r':   /* set random number seed for parameter gen */
                flags |= SEED;
                rndm = atol(optarg);
                break;
            case 's':   /* scale of data set to run against */
                flt_scale = atof(optarg);
				if (scale > MAX_SCALE)
					fprintf(stderr, "%s %5.0f %s\n%s\n",
						"WARNING: Support for scale factors >",
						MAX_SCALE,
						"GB is still in development.",
						"Data set integrity is not guaranteed.\n");
                break;
            case 't':   /* set termination file name */
                tfile = malloc((int)strlen(optarg) + 1);
                MALLOC_CHECK(tfile);
                strcpy(tfile, optarg);
                flags |= TERMINATE;
                break;
            case 'v':   /* verbose */
                flags |= VERBOSE;
                break;
            case 'x':   /* set explain in the queries */
                flags |= EXPLAIN;
                break;
            default:
                printf("unknown option '%s' ignored\n", args[optind]);
                usage();
                exit(1);
                break;
            }
    return(0);
}